

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O1

int fffr4i4(float *input,long ntodo,double scale,double zero,int nullcheck,long nullval,
           char *nullarray,int *anynull,long *output,int *status)

{
  float fVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar3 = 0;
        do {
          dVar6 = (double)input[lVar3] * scale + zero;
          if (-9.223372036854775e+18 <= dVar6) {
            if (dVar6 <= 9.223372036854775e+18) {
              lVar4 = (long)dVar6;
            }
            else {
              *status = -0xb;
              lVar4 = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            lVar4 = -0x8000000000000000;
          }
          output[lVar3] = lVar4;
          lVar3 = lVar3 + 1;
        } while (ntodo != lVar3);
      }
    }
    else if (0 < ntodo) {
      lVar3 = 0;
      do {
        fVar1 = input[lVar3];
        if (-9.223372e+18 <= fVar1) {
          if (fVar1 <= 9.223372e+18) {
            lVar4 = (long)fVar1;
          }
          else {
            *status = -0xb;
            lVar4 = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          lVar4 = -0x8000000000000000;
        }
        output[lVar3] = lVar4;
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar3 = 0;
      do {
        uVar2 = *(ushort *)((long)input + lVar3 * 4 + 2);
        cVar5 = ((uVar2 & 0x7f80) == 0) * '\x02';
        if ((uVar2 & 0x7f80) == 0x7f80) {
          cVar5 = '\x01';
        }
        if (cVar5 == '\0') {
          dVar6 = (double)input[lVar3] * scale + zero;
          if (dVar6 < -9.223372036854775e+18) {
LAB_00198fee:
            *status = -0xb;
            output[lVar3] = -0x8000000000000000;
          }
          else {
            if (9.223372036854775e+18 < dVar6) {
LAB_00199007:
              *status = -0xb;
              lVar4 = 0x7fffffffffffffff;
            }
            else {
              lVar4 = (long)dVar6;
            }
            output[lVar3] = lVar4;
          }
        }
        else if (cVar5 == '\x01') {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else {
          if (zero < -9.223372036854775e+18) goto LAB_00198fee;
          if (9.223372036854775e+18 < zero) goto LAB_00199007;
          output[lVar3] = (long)zero;
        }
        lVar3 = lVar3 + 1;
      } while (ntodo != lVar3);
    }
  }
  else if (0 < ntodo) {
    lVar3 = 0;
    do {
      uVar2 = *(ushort *)((long)input + lVar3 * 4 + 2);
      cVar5 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar5 = '\x01';
      }
      if (cVar5 == '\0') {
        fVar1 = input[lVar3];
        if (-9.223372e+18 <= fVar1) {
          if (fVar1 <= 9.223372e+18) {
            output[lVar3] = (long)fVar1;
          }
          else {
            *status = -0xb;
            output[lVar3] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[lVar3] = -0x8000000000000000;
        }
      }
      else if (cVar5 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar3] = nullval;
        }
        else {
          nullarray[lVar3] = '\x01';
        }
      }
      else {
        output[lVar3] = 0;
      }
      lVar3 = lVar3 + 1;
    } while (ntodo != lVar3);
  }
  return *status;
}

Assistant:

int fffr4i4(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DLONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MIN;
                }
                else if (input[ii] > DLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MAX;
                }
                else
                    output[ii] = (long) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DLONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MIN;
                }
                else if (dvalue > DLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONG_MAX;
                }
                else
                    output[ii] = (long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MIN;
                    }
                    else if (input[ii] > DLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MAX;
                    }
                    else
                        output[ii] = (long) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  {
                    if (zero < DLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MIN;
                    }
                    else if (zero > DLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MAX;
                    }
                    else
                        output[ii] = (long) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MIN;
                    }
                    else if (dvalue > DLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONG_MAX;
                    }
                    else
                        output[ii] = (long) dvalue;
                }
            }
        }
    }
    return(*status);
}